

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<unsigned_short,unsigned_short,unsigned_short,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  bool bVar1;
  unsigned_short uVar2;
  unsigned_short *puVar3;
  unsigned_short *puVar4;
  unsigned_short *puVar5;
  undefined1 in_CL;
  Vector *in_RDX;
  Vector *in_RSI;
  bool in_stack_0000000f;
  unsigned_short *result_data;
  unsigned_short *rdata;
  unsigned_short *ldata;
  ValidityMask *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc2;
  unsigned_short right_00;
  undefined1 fun_00;
  
  Vector::SetVectorType(in_RSI,(VectorType)((ulong)in_RDX >> 0x38));
  puVar3 = ConstantVector::GetData<unsigned_short>((Vector *)0x130f334);
  puVar4 = ConstantVector::GetData<unsigned_short>((Vector *)0x130f343);
  puVar5 = ConstantVector::GetData<unsigned_short>((Vector *)0x130f352);
  bVar1 = ConstantVector::IsNull((Vector *)0x130f361);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0x130f36f), !bVar1)) {
    right_00 = CONCAT11(in_CL,in_stack_ffffffffffffffc2) & 0x1ff;
    uVar2 = *puVar3;
    fun_00 = (undefined1)(*puVar4 >> 8);
    ConstantVector::Validity(in_RDX);
    uVar2 = BinaryStandardOperatorWrapper::
            Operation<bool,duckdb::MultiplyOperator,unsigned_short,unsigned_short,unsigned_short>
                      ((bool)fun_00,uVar2,right_00,in_stack_ffffffffffffffb8,0x130f3dc);
    *puVar5 = uVar2;
    return;
  }
  ConstantVector::SetNull((Vector *)result_data,in_stack_0000000f);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}